

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int file_write(FILE *stream,void *buffer,size_t size)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = fwrite_unlocked(buffer,size,1,(FILE *)stream);
  if ((size == 0) || (sVar2 == 1)) {
    fflush((FILE *)stream);
    iVar1 = 1;
  }
  else {
    file_write_cold_1();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
file_write(
    FILE* stream,
    const void* buffer,
    size_t size)
{
    if (fwrite_unlocked(buffer, size, 1, stream) != 1 && size != 0) {
        fprintf(stderr, "%s: failed writing %lu bytes: %s\n",
            argv0, (long unsigned int)size, strerror(errno));
        return 0;
    }
    else {
        fflush(stream);
        return 1;
    }
}